

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O0

bool __thiscall GraphViewer::createWindow(GraphViewer *this,int width,int height)

{
  Connection *this_00;
  bool bVar1;
  string local_140 [55];
  allocator local_109;
  string local_108 [8];
  string str;
  char local_e8 [8];
  char buff [200];
  int height_local;
  int width_local;
  GraphViewer *this_local;
  
  sprintf(local_e8,"createWindow %d %d\n",(ulong)(uint)width,(ulong)(uint)height);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,local_e8,&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  this_00 = this->con;
  std::__cxx11::string::string(local_140,local_108);
  bVar1 = Connection::sendMsg(this_00,(string *)local_140);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_108);
  return bVar1;
}

Assistant:

bool GraphViewer::createWindow(int width, int height) {
	char buff[200];
	sprintf(buff, "createWindow %d %d\n", width, height);
	string str(buff);
	return con->sendMsg(str);
}